

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

void __thiscall
args::
Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
::~Positional(Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
              *this)

{
  pointer pcVar1;
  
  (this->super_PositionalBase).super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__Positional_00122bd8;
  pcVar1 = (this->defaultValue)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->defaultValue).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->value)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->value).field_2) {
    operator_delete(pcVar1);
  }
  NamedBase::~NamedBase((NamedBase *)this);
  return;
}

Assistant:

virtual ~Positional() {}